

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cc
# Opt level: O0

void __thiscall tt::net::Channel::~Channel(Channel *this)

{
  Channel *this_local;
  
  std::function<void_()>::~function(&this->m_connHandler);
  std::function<void_()>::~function(&this->m_errorHandler);
  std::function<void_()>::~function(&this->m_writeHandler);
  std::function<void_()>::~function(&this->m_readHandler);
  std::weak_ptr<tt::net::HttpData>::~weak_ptr(&this->m_holder);
  return;
}

Assistant:

Channel::~Channel(){}